

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

bool __thiscall
presolve::HPresolve::checkFillin
          (HPresolve *this,HighsHashTable<int,_int> *fillinCache,HighsInt row,HighsInt col)

{
  pointer piVar1;
  bool bVar2;
  HighsInt HVar3;
  ValueType *pVVar4;
  int iVar5;
  int iVar6;
  u8 meta;
  u64 pos;
  u64 maxPos;
  u64 startPos;
  u8 local_51;
  long local_50;
  u64 local_48;
  u64 local_40;
  u64 local_38;
  
  local_50 = (long)col;
  iVar5 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[local_50];
  if (iVar5 != -1) {
    iVar6 = 1 - ((this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[row] +
                (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[local_50]);
    do {
      piVar1 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((piVar1[iVar5] != row) &&
          (bVar2 = HighsHashTable<int,_int>::findPosition
                             (fillinCache,piVar1 + iVar5,&local_51,&local_38,&local_40,&local_48),
          bVar2)) &&
         (iVar6 = iVar6 + *(int *)((long)((fillinCache->entries)._M_t.
                                          super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
                                          .
                                          super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>
                                          ._M_head_impl + local_48) + 4) + -1,
         (this->options->super_HighsOptionsStruct).presolve_substitution_maxfillin < iVar6)) {
        return false;
      }
      iVar5 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar5];
    } while (iVar5 != -1);
    for (iVar5 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_50]; iVar5 != -1;
        iVar5 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar5]) {
      piVar1 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((piVar1[iVar5] != row) &&
         (pVVar4 = HighsHashTable<int,_int>::operator[](fillinCache,piVar1 + iVar5), *pVVar4 == 0))
      {
        HVar3 = countFillin(this,(this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar5]);
        *pVVar4 = HVar3 + 1;
        iVar6 = iVar6 + HVar3;
        if ((this->options->super_HighsOptionsStruct).presolve_substitution_maxfillin < iVar6) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool HPresolve::checkFillin(HighsHashTable<HighsInt, HighsInt>& fillinCache,
                            HighsInt row, HighsInt col) {
  // check numerics against markowitz tolerance
  assert(rowpositions.size() == static_cast<size_t>(rowsize[row]));

  // check fillin against max fillin
  HighsInt fillin = -(rowsize[row] + colsize[col] - 1);

#if 1
  // first use fillin for rows where it is already computed
  for (HighsInt coliter = colhead[col]; coliter != -1;
       coliter = Anext[coliter]) {
    if (Arow[coliter] == row) continue;

    auto cachedFillin = fillinCache.find(Arow[coliter]);
    if (cachedFillin == nullptr) continue;

    fillin += (*cachedFillin - 1);
    if (fillin > options->presolve_substitution_maxfillin) return false;
  }

  // iterate over rows of substituted column again to count the fillin for the
  // remaining rows
  for (HighsInt coliter = colhead[col]; coliter != -1;
       coliter = Anext[coliter]) {
    assert(Acol[coliter] == col);

    if (Arow[coliter] == row) continue;

    HighsInt& cachedFillin = fillinCache[Arow[coliter]];

    if (cachedFillin != 0) continue;

    HighsInt rowfillin = countFillin(Arow[coliter]);
    cachedFillin = rowfillin + 1;
    fillin += rowfillin;

    if (fillin > options->presolve_substitution_maxfillin) return false;
    // we count a fillin of 1 if the column is not present in the row and
    // a fillin of zero otherwise. the fillin for the substituted column
    // itself was already counted before the loop so we skip that entry.
  }
#else
  for (HighsInt rowiter : rowpositions) {
    if (rowiter == pos) continue;
    for (coliter = colhead[col]; coliter != -1; coliter = Anext[coliter]) {
      assert(Acol[coliter] == col);

      if (rowiter != coliter &&
          findNonzero(Arow[coliter], Acol[rowiter]) == -1) {
        if (fillin == maxfillin) return false;
        fillin += 1;
      }
    }
  }
#endif

  return true;
}